

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_vararg.c
# Opt level: O1

int mpt_process_vararg(char *fmt,__va_list_tag *arg,_func_int_void_ptr_mpt_iterator_ptr *proc,
                      void *ctx)

{
  int iVar1;
  iteratorVararg va;
  iteratorVararg local_78;
  
  if (proc == (_func_int_void_ptr_mpt_iterator_ptr *)0x0) {
    return -1;
  }
  local_78._it._vptr = &mpt_process_vararg::ctl;
  local_78.fmt = fmt;
  local_78.org.fmt = fmt;
  if ((fmt == (char *)0x0) || (*fmt == '\0')) {
    local_78.val._addr = (void *)0x0;
    local_78.val._type = 0;
  }
  else {
    local_78.arg[0].reg_save_area = arg->reg_save_area;
    local_78.arg[0].gp_offset = arg->gp_offset;
    local_78.arg[0].fp_offset = arg->fp_offset;
    local_78.arg[0].overflow_arg_area = arg->overflow_arg_area;
    local_78.org.arg[0].gp_offset = arg->gp_offset;
    local_78.org.arg[0].fp_offset = arg->fp_offset;
    local_78.org.arg[0].overflow_arg_area = arg->overflow_arg_area;
    local_78.org.arg[0].reg_save_area = arg->reg_save_area;
    iVar1 = _iteratorVarargNext(&local_78);
    if (iVar1 < 0) {
      return iVar1;
    }
  }
  iVar1 = (*proc)(ctx,&local_78._it);
  return iVar1;
}

Assistant:

extern int mpt_process_vararg(const char *fmt, va_list arg, int (*proc)(void *, MPT_INTERFACE(iterator) *), void *ctx)
{
	static const MPT_INTERFACE_VPTR(iterator) ctl = {
		iteratorVarargValue,
		iteratorVarargAdvance,
		iteratorVarargReset
	};
	struct iteratorVararg va;
	int type;
	int ret;
	
	if (!proc) {
		return MPT_ERROR(BadArgument);
	}
	va._it._vptr = &ctl;
	va.org.fmt = fmt;
	va.fmt = fmt;
	if (!fmt || !(type = *fmt)) {
		MPT_value_set(&va.val, 0, 0);
		return proc(ctx, &va._it);
	}
	va_copy(va.arg, arg);
	va_copy(va.org.arg, arg);
	if ((ret = _iteratorVarargNext(&va)) >= 0) {
		ret = proc(ctx, &va._it);
	}
	va_end(va.org.arg);
	va_end(va.arg);
	return ret;
}